

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlsavoCtrl.cpp
# Opt level: O0

void __thiscall AlsavoSession::Disconnect(AlsavoSession *this)

{
  initializer_list<unsigned_char> __l;
  Verbosity VVar1;
  double __x;
  allocator<unsigned_char> local_3d;
  uchar local_3c [4];
  iterator local_38;
  size_type local_30;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  AlsavoSession *local_10;
  AlsavoSession *this_local;
  
  local_10 = this;
  VVar1 = loguru::current_verbosity_cutoff();
  if (-1 < VVar1) {
    loguru::log(__x);
  }
  if (this->m_ConnectionStatus == Connected) {
    local_3c[0] = '\a';
    local_3c[1] = 0;
    local_3c[2] = 0;
    local_3c[3] = 0;
    local_38 = local_3c;
    local_30 = 4;
    CLI::std::allocator<unsigned_char>::allocator(&local_3d);
    __l._M_len = local_30;
    __l._M_array = local_38;
    CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&local_28,__l,&local_3d)
    ;
    SendPacketNow(this,&local_28,0,false,0xf3);
    CLI::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
    CLI::std::allocator<unsigned_char>::~allocator(&local_3d);
  }
  UpdateConnectionStatus(this,Disconnected);
  this->m_NextSeq = 0;
  CLI::std::deque<AlsavoSession::PacketQueueItem,_std::allocator<AlsavoSession::PacketQueueItem>_>::
  clear(&this->m_OutQueue);
  if (this->m_Sock != 0) {
    close(this->m_Sock);
    this->m_Sock = 0;
  }
  return;
}

Assistant:

void Disconnect()
	{
		LOG_F(INFO, "Disconnecting.");
		if (m_ConnectionStatus == ConnectionStatus::Connected)
		{
			SendPacketNow({ 0x07, 0, 0, 0 }, 0, false, 0xf3);
		}
		UpdateConnectionStatus(ConnectionStatus::Disconnected);
		m_NextSeq = 0;
		m_OutQueue.clear();
		if (m_Sock != 0)
		{
#ifdef _MSC_VER
			closesocket(m_Sock);
#else
			close(m_Sock);
#endif
			m_Sock = 0;
		}
	}